

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::ComputeBuiltinVarCase
          (ComputeBuiltinVarCase *this,Context *context,char *name,char *varName,DataType varType)

{
  char *__s;
  allocator<char> local_2d;
  DataType local_2c;
  char *pcStack_28;
  DataType varType_local;
  char *varName_local;
  char *name_local;
  Context *context_local;
  ComputeBuiltinVarCase *this_local;
  
  local_2c = varType;
  pcStack_28 = varName;
  varName_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  TestCase::TestCase(&this->super_TestCase,context,name,varName);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_011d14a8;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::vector(&this->m_subCases);
  __s = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_varName,__s,&local_2d);
  std::allocator<char>::~allocator(&local_2d);
  this->m_varType = local_2c;
  std::
  map<tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
  ::map(&this->m_progMap);
  this->m_subCaseNdx = 0;
  return;
}

Assistant:

ComputeBuiltinVarCase::ComputeBuiltinVarCase (Context& context, const char* name, const char* varName, DataType varType)
	: TestCase		(context, name, varName)
	, m_varName		(varName)
	, m_varType		(varType)
	, m_subCaseNdx	(0)
{
}